

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5HeapArgumentsObject::IsEnumerableByIndex(ES5HeapArgumentsObject *this,uint32 index)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 *puVar6;
  JavascriptString *propertyString;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  
  scriptContext =
       (((((this->super_HeapArgumentsObject).super_ArgumentsObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  propertyRecord = (PropertyRecord *)(double)index;
  uVar4 = NumberUtilities::ToSpecial((double)propertyRecord);
  bVar2 = NumberUtilities::IsNan((double)propertyRecord);
  if (bVar2) {
    uVar5 = NumberUtilities::ToSpecial((double)propertyRecord);
    if (uVar5 != 0xfff8000000000000) {
      uVar5 = NumberUtilities::ToSpecial((double)propertyRecord);
      if (uVar5 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
    }
  }
  propertyString = JavascriptConversion::ToString((Var)(uVar4 ^ 0xfffc000000000000),scriptContext);
  ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,&local_38);
  iVar3 = (*(this->super_HeapArgumentsObject).super_ArgumentsObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x32])(this,(ulong)(uint)local_38->pid);
  return iVar3;
}

Assistant:

BOOL ES5HeapArgumentsObject::IsEnumerableByIndex(uint32 index)
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        Var indexNumber = JavascriptNumber::New(index, scriptContext);
        JavascriptString* indexPropertyName = JavascriptConversion::ToString(indexNumber, scriptContext);
        PropertyRecord const * propertyRecord;
        scriptContext->GetOrAddPropertyRecord(indexPropertyName, &propertyRecord);
        return this->IsEnumerable(propertyRecord->GetPropertyId());
    }